

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

int32 __thiscall nuraft::raft_server::get_quorum_for_commit(raft_server *this)

{
  bool bVar1;
  element_type *peVar2;
  ptr<peer> *p;
  pair<const_int,_std::shared_ptr<nuraft::peer>_> *entry;
  iterator __end2;
  iterator __begin2;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *__range2;
  int32 num_voting_members;
  ptr<raft_params> params;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  byte bVar3;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  __shared_ptr local_70 [16];
  shared_ptr<nuraft::peer> *local_60;
  reference local_58;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_50;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_48;
  raft_server *in_stack_ffffffffffffffc0;
  int local_24;
  int local_4;
  
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x21bc58);
  nuraft::context::get_params
            ((context *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_24 = get_num_voting_members(in_stack_ffffffffffffffc0);
  peVar2 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x21bc87);
  if ((peVar2->exclude_snp_receiver_from_quorum_ & 1U) != 0) {
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::begin(in_stack_ffffffffffffff68);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end(in_stack_ffffffffffffff68);
    while (bVar1 = std::__detail::operator!=(&local_48,&local_50), bVar1) {
      local_58 = std::__detail::
                 _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                 ::operator*((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                              *)0x21bce1);
      local_60 = &local_58->second;
      in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c & 0xffffff;
      bVar3 = false;
      if (local_24 != 0) {
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x21bd12);
        peer::get_snapshot_sync_ctx
                  ((peer *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        in_stack_ffffffffffffff8c = CONCAT13(1,(int3)in_stack_ffffffffffffff8c);
        bVar3 = std::__shared_ptr::operator_cast_to_bool(local_70);
      }
      uVar4 = bVar3;
      if ((in_stack_ffffffffffffff8c & 0x1000000) != 0) {
        std::shared_ptr<nuraft::snapshot_sync_ctx>::~shared_ptr
                  ((shared_ptr<nuraft::snapshot_sync_ctx> *)0x21bd4f);
      }
      if ((bVar3 & 1) != 0) {
        local_24 = local_24 + -1;
      }
      std::__detail::
      _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::operator++
                ((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)CONCAT17(uVar4,CONCAT16(bVar3,in_stack_ffffffffffffff70)));
    }
  }
  peVar2 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x21bda0);
  if ((peVar2->custom_commit_quorum_size_ < 1) ||
     (peVar2 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x21bdb0), local_24 < peVar2->custom_commit_quorum_size_)) {
    local_4 = local_24 / 2;
  }
  else {
    peVar2 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x21bde0);
    local_4 = peVar2->custom_commit_quorum_size_ + -1;
  }
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x21bdff);
  return local_4;
}

Assistant:

int32 raft_server::get_quorum_for_commit() {
    ptr<raft_params> params = ctx_->get_params();
    int32 num_voting_members = get_num_voting_members();

    if (params->exclude_snp_receiver_from_quorum_){
        // If the option is on, exclude any peer who is
        // receiving snapshot.
        for (auto& entry: peers_) {
            ptr<peer>& p = entry.second;
            if ( num_voting_members &&
                 p->get_snapshot_sync_ctx() ) {
                num_voting_members--;
            }
        }
    }

    if ( params->custom_commit_quorum_size_ <= 0 ||
         params->custom_commit_quorum_size_ > num_voting_members ) {
        return num_voting_members / 2;
    }
    return params->custom_commit_quorum_size_ - 1;
}